

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserEvent.h
# Opt level: O0

void __thiscall
UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UserEvent(UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,UserEvent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *ev)

{
  long in_RSI;
  Event *in_RDI;
  
  Event::Event(in_RDI,*(Type *)(in_RSI + 8));
  in_RDI->_vptr_Event = (_func_int **)&PTR__UserEvent_00115b10;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 0x10));
  return;
}

Assistant:

UserEvent(const UserEvent<T> &ev) :
            Event(ev.type), object(ev.object) {}